

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

int Gia_ManResubVerify(Gia_ResbMan_t *p,word *pFunc)

{
  Vec_Ptr_t *p_00;
  Vec_Wrd_t *p_01;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint i;
  uint uVar6;
  ulong uVar7;
  word *pwVar8;
  word *pIn2;
  word *pOut;
  long lVar9;
  ulong uVar10;
  ulong in_R8;
  
  if (p->vGates->nSize == 0) {
    return -1;
  }
  iVar2 = p->vDivs->nSize;
  iVar1 = Vec_IntEntryLast(p->vGates);
  if (iVar1 < 0) {
    __assert_fail("iTopLit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                  ,0x1cf,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
  }
  if (iVar1 == 1) {
    uVar6 = p->nWords;
    if (pFunc != (word *)0x0) {
      uVar7 = 0;
      uVar10 = 0;
      if (0 < (int)uVar6) {
        uVar10 = (ulong)uVar6;
      }
      for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
        pFunc[uVar7] = 0xffffffffffffffff;
      }
    }
    pwVar8 = p->pSets[0];
LAB_0061a57b:
    iVar2 = Abc_TtIsConst0(pwVar8,uVar6);
    return iVar2;
  }
  if (iVar1 == 0) {
    uVar6 = p->nWords;
    if (pFunc != (word *)0x0) {
      uVar7 = 0;
      uVar10 = 0;
      if (0 < (int)uVar6) {
        uVar10 = (ulong)uVar6;
      }
      for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
        pFunc[uVar7] = 0;
      }
    }
    pwVar8 = p->pSets[1];
    goto LAB_0061a57b;
  }
  iVar3 = Abc_Lit2Var(iVar1);
  iVar4 = (int)in_R8;
  uVar6 = p->vGates->nSize;
  if (iVar3 < iVar2) {
    if (uVar6 != 1) {
      __assert_fail("Vec_IntSize(p->vGates) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                    ,0x1dc,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
    }
    p_00 = p->vDivs;
    iVar2 = Abc_Lit2Var(iVar1);
    pwVar8 = (word *)Vec_PtrEntry(p_00,iVar2);
  }
  else {
    if ((int)uVar6 < 2) {
      __assert_fail("Vec_IntSize(p->vGates) > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                    ,0x1e2,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
    }
    if ((uVar6 & 1) == 0) {
      __assert_fail("Vec_IntSize(p->vGates) % 2 == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                    ,0x1e3,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
    }
    iVar4 = Abc_Lit2Var(iVar1);
    iVar3 = p->vGates->nSize;
    if (iVar4 - iVar2 != iVar3 / 2 + -1) {
      __assert_fail("Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(p->vGates)/2-1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                    ,0x1e4,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
    }
    p_01 = p->vSims;
    uVar7 = (long)(iVar3 * p->nWords) / 2;
    iVar3 = (int)uVar7;
    uVar7 = uVar7 & 0xffffffff;
    Vec_WrdGrow(p_01,iVar3);
    uVar10 = 0;
    if (iVar3 < 1) {
      uVar7 = 0;
    }
    for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      p_01->pArray[uVar10] = 0;
    }
    p_01->nSize = iVar3;
    iVar3 = 1;
    while( true ) {
      iVar4 = (int)in_R8;
      iVar5 = p->vGates->nSize;
      if (iVar5 <= iVar3) break;
      iVar4 = Vec_IntEntry(p->vGates,iVar3 + -1);
      iVar5 = Vec_IntEntry(p->vGates,iVar3);
      uVar6 = Abc_Lit2Var(iVar4);
      i = Abc_Lit2Var(iVar5);
      if ((int)uVar6 < iVar2) {
        pwVar8 = (word *)Vec_PtrEntry(p->vDivs,uVar6);
      }
      else {
        pwVar8 = Vec_WrdEntryP(p->vSims,(uVar6 - iVar2) * p->nWords);
      }
      if ((int)i < iVar2) {
        pIn2 = (word *)Vec_PtrEntry(p->vDivs,i);
      }
      else {
        pIn2 = Vec_WrdEntryP(p->vSims,(i - iVar2) * p->nWords);
      }
      pOut = Vec_WrdEntryP(p->vSims,(iVar3 + -1) * p->nWords >> 1);
      if (uVar6 < i) {
        iVar4 = Abc_LitIsCompl(iVar4);
        uVar6 = Abc_LitIsCompl(iVar5);
        in_R8 = (ulong)uVar6;
        Abc_TtAndCompl(pOut,pwVar8,iVar4,pIn2,uVar6,p->nWords);
      }
      else {
        if (uVar6 <= i) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                        ,0x1f5,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
        }
        iVar4 = Abc_LitIsCompl(iVar4);
        if (iVar4 != 0) {
          __assert_fail("!Abc_LitIsCompl(iLit0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                        ,0x1f1,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
        }
        iVar4 = Abc_LitIsCompl(iVar5);
        if (iVar4 != 0) {
          __assert_fail("!Abc_LitIsCompl(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                        ,0x1f2,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
        }
        Abc_TtXor(pOut,pwVar8,pIn2,p->nWords,(int)in_R8);
      }
      iVar3 = iVar3 + 2;
    }
    pwVar8 = Vec_WrdEntryP(p->vSims,(iVar5 / 2 + -1) * p->nWords);
  }
  iVar3 = Abc_LitIsCompl(iVar1);
  iVar2 = p->nWords;
  iVar5 = (int)pwVar8;
  if (iVar3 == 0) {
    uVar6 = 0;
    iVar3 = Abc_TtIntersectOne(p->pSets[0],iVar5,(word *)0x0,iVar2,iVar4);
    if (iVar3 != 0) goto LAB_0061a82e;
    lVar9 = 0x98;
  }
  else {
    uVar6 = 0;
    iVar3 = Abc_TtIntersectOne(p->pSets[1],iVar5,(word *)0x0,iVar2,iVar4);
    if (iVar3 != 0) goto LAB_0061a82e;
    lVar9 = 0x90;
  }
  uVar6 = Abc_TtIntersectOne(*(word **)((long)p->vUnateLits + lVar9 + -0x30),iVar5,(word *)0x1,iVar2
                             ,iVar4);
  uVar6 = uVar6 ^ 1;
LAB_0061a82e:
  if (pFunc != (word *)0x0) {
    iVar1 = Abc_LitIsCompl(iVar1);
    Abc_TtCopy(pFunc,pwVar8,iVar2,iVar1);
  }
  return uVar6;
}

Assistant:

int Gia_ManResubVerify( Gia_ResbMan_t * p, word * pFunc )
{
    int nVars = Vec_PtrSize(p->vDivs);
    int iTopLit, RetValue;
    word * pDivRes; 
    if ( Vec_IntSize(p->vGates) == 0 )
        return -1;
    iTopLit = Vec_IntEntryLast(p->vGates);
    assert( iTopLit >= 0 );
    if ( iTopLit == 0 )
    {
        if ( pFunc ) Abc_TtClear( pFunc, p->nWords );
        return Abc_TtIsConst0( p->pSets[1], p->nWords );
    }
    if ( iTopLit == 1 )
    {
        if ( pFunc ) Abc_TtFill( pFunc, p->nWords );
        return Abc_TtIsConst0( p->pSets[0], p->nWords );
    }
    if ( Abc_Lit2Var(iTopLit) < nVars )
    {
        assert( Vec_IntSize(p->vGates) == 1 );
        pDivRes = (word *)Vec_PtrEntry( p->vDivs, Abc_Lit2Var(iTopLit) );
    }
    else
    {
        int i, iLit0, iLit1;
        assert( Vec_IntSize(p->vGates) > 1 );
        assert( Vec_IntSize(p->vGates) % 2 == 1 );
        assert( Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(p->vGates)/2-1 );
        Vec_WrdFill( p->vSims, p->nWords * Vec_IntSize(p->vGates)/2, 0 );
        Vec_IntForEachEntryDouble( p->vGates, iLit0, iLit1, i )
        {
            int iVar0 = Abc_Lit2Var(iLit0);
            int iVar1 = Abc_Lit2Var(iLit1);
            word * pDiv0 = iVar0 < nVars ? (word *)Vec_PtrEntry(p->vDivs, iVar0) : Vec_WrdEntryP(p->vSims, p->nWords*(iVar0 - nVars));
            word * pDiv1 = iVar1 < nVars ? (word *)Vec_PtrEntry(p->vDivs, iVar1) : Vec_WrdEntryP(p->vSims, p->nWords*(iVar1 - nVars));
            word * pDiv  = Vec_WrdEntryP(p->vSims, p->nWords*i/2);
            if ( iVar0 < iVar1 )
                Abc_TtAndCompl( pDiv, pDiv0, Abc_LitIsCompl(iLit0), pDiv1, Abc_LitIsCompl(iLit1), p->nWords );
            else if ( iVar0 > iVar1 )
            {
                assert( !Abc_LitIsCompl(iLit0) );
                assert( !Abc_LitIsCompl(iLit1) );
                Abc_TtXor( pDiv, pDiv0, pDiv1, p->nWords, 0 );
            }
            else assert( 0 );
        }
        pDivRes = Vec_WrdEntryP( p->vSims, p->nWords*(Vec_IntSize(p->vGates)/2-1) );
    }
    if ( Abc_LitIsCompl(iTopLit) )
        RetValue = !Abc_TtIntersectOne(p->pSets[1], 0, pDivRes, 0, p->nWords) && !Abc_TtIntersectOne(p->pSets[0], 0, pDivRes, 1, p->nWords);
    else
        RetValue = !Abc_TtIntersectOne(p->pSets[0], 0, pDivRes, 0, p->nWords) && !Abc_TtIntersectOne(p->pSets[1], 0, pDivRes, 1, p->nWords);
    if ( pFunc ) Abc_TtCopy( pFunc, pDivRes, p->nWords, Abc_LitIsCompl(iTopLit) );
    return RetValue;
}